

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O3

ssize_t __thiscall zmq::mailbox_t::send(mailbox_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic_ptr_t<zmq::command_t> *paVar1;
  command_t *pcVar2;
  int iVar3;
  command_t *pcVar4;
  undefined4 extraout_var;
  ssize_t sVar5;
  command_t *__n_00;
  size_t __n_01;
  void *__n_02;
  void *pvVar6;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  void *__buf_00;
  bool bVar7;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar6 = __buf_00;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_sync);
  if (iVar3 != 0) {
    send(iVar3,pvVar6,__n_01,(int)__n);
  }
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,__fd,(void *)0x0,__n);
  __n_00 = (this->_cpipe)._w;
  pcVar2 = (this->_cpipe)._f;
  if (__n_00 == pcVar2) {
    bVar7 = true;
  }
  else {
    paVar1 = &(this->_cpipe)._c;
    LOCK();
    pcVar4 = (paVar1->_ptr)._M_b._M_p;
    bVar7 = __n_00 == pcVar4;
    if (bVar7) {
      (paVar1->_ptr)._M_b._M_p = pcVar2;
      pcVar4 = __n_00;
    }
    UNLOCK();
    if (bVar7) {
      pcVar4 = __n_00;
    }
    __n_00 = (this->_cpipe)._f;
    bVar7 = pcVar4 == (this->_cpipe)._w;
    if (!bVar7) {
      LOCK();
      (this->_cpipe)._c._ptr._M_b._M_p = __n_00;
      UNLOCK();
    }
    (this->_cpipe)._w = __n_00;
  }
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->_sync);
  sVar5 = CONCAT44(extraout_var,iVar3);
  pvVar6 = __n_02;
  if (iVar3 != 0) {
    sVar5 = send(iVar3,__buf_00,(size_t)__n_02,(int)__n_00);
    pvVar6 = extraout_RDX;
  }
  if (!bVar7) {
    sVar5 = signaler_t::send(&this->_signaler,(int)__buf_00,pvVar6,(size_t)__n_00,__flags);
    return sVar5;
  }
  return sVar5;
}

Assistant:

void zmq::mailbox_t::send (const command_t &cmd_)
{
    _sync.lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();
    _sync.unlock ();
    if (!ok)
        _signaler.send ();
}